

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipMessage
               (CodedInputStream *input,CodedOutputStream *output)

{
  bool bVar1;
  WireType WVar2;
  WireType wire_type;
  uint32 tag;
  CodedOutputStream *output_local;
  CodedInputStream *input_local;
  uint32 local_1c;
  uint32 v;
  uint32 local_c;
  
  do {
    local_1c = 0;
    if ((input->buffer_ < input->buffer_end_) &&
       (local_1c = (uint32)*input->buffer_, local_1c < 0x80)) {
      input->last_tag_ = local_1c;
      io::CodedInputStream::Advance(input,1);
      local_c = local_1c;
    }
    else {
      local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
      input->last_tag_ = local_c;
    }
    if (local_c == 0) {
      return true;
    }
    WVar2 = GetTagWireType(local_c);
    if (WVar2 == WIRETYPE_END_GROUP) {
      io::CodedOutputStream::WriteVarint32(output,local_c);
      return true;
    }
    bVar1 = SkipField(input,local_c,output);
  } while (bVar1);
  return false;
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input,
    io::CodedOutputStream* output) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      output->WriteVarint32(tag);
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, output)) return false;
  }
}